

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_4_suite::test_same_increment_by_one(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe98;
  double local_150;
  value_type local_148;
  value_type local_140;
  double local_130;
  value_type local_128;
  value_type local_120;
  double local_110;
  value_type local_108;
  value_type local_100;
  double local_f0;
  value_type local_e8;
  value_type local_e0;
  double local_d0;
  value_type local_c8;
  value_type local_c0;
  double local_b0;
  value_type local_a8;
  value_type local_a0;
  double local_90;
  value_type local_88 [4];
  undefined1 local_68 [8];
  covariance<double,_4> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.passive.center,1e-05,absolute_tolerance);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,1.0,1.0);
  local_88[2] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_88[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x9a,"void double_4_suite::test_same_increment_by_one()",local_88 + 2,local_88 + 1);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,2.0,2.0);
  local_88[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_90 = 0.25;
  local_a0 = filter.passive.center;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0x9d,0x10632d,(char *)local_88,&local_90,in_stack_fffffffffffffe98,
             predicate_05);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,3.0,3.0);
  local_a8 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_b0 = 0.666667;
  local_c0 = filter.passive.center;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.666667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xa0,0x10632d,(char *)&local_a8,&local_b0,in_stack_fffffffffffffe98,
             predicate_04);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,4.0,4.0);
  local_c8 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_d0 = 1.25;
  local_e0 = filter.passive.center;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xa3,0x10632d,(char *)&local_c8,&local_d0,in_stack_fffffffffffffe98,
             predicate_03);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,5.0,5.0);
  local_e8 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_f0 = 1.25;
  local_100 = filter.passive.center;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xa7,0x10632d,(char *)&local_e8,&local_f0,in_stack_fffffffffffffe98,
             predicate_02);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,6.0,6.0);
  local_108 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_110 = 1.06818;
  local_120 = filter.passive.center;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.06818","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xaa,0x10632d,(char *)&local_108,&local_110,in_stack_fffffffffffffe98,
             predicate_01);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,7.0,7.0);
  local_128 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_130 = 0.95833;
  local_140 = filter.passive.center;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.95833","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xad,0x10632d,(char *)&local_128,&local_130,in_stack_fffffffffffffe98,
             predicate_00);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68,8.0,8.0);
  local_148 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_68);
  local_150 = 1.25;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.passive.center;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,(char *)0xb0,0x10632d,(char *)&local_148,&local_150,in_stack_fffffffffffffe98,
             predicate);
  return;
}

Assistant:

void test_same_increment_by_one()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    interim::covariance<double, 4> filter;

    filter.push(1.0, 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_WITH(filter.variance(), 0.25, tolerance);

    filter.push(3.0, 3.0);
    TRIAL_TEST_WITH(filter.variance(), 0.666667, tolerance);

    filter.push(4.0, 4.0);
    TRIAL_TEST_WITH(filter.variance(), 1.25, tolerance);

    // Window full
    filter.push(5.0, 5.0);
    TRIAL_TEST_WITH(filter.variance(), 1.25, tolerance);

    filter.push(6.0, 6.0);
    TRIAL_TEST_WITH(filter.variance(), 1.06818, tolerance); // 1.25

    filter.push(7.0, 7.0);
    TRIAL_TEST_WITH(filter.variance(), 0.95833, tolerance); // 1.25

    filter.push(8.0, 8.0);
    TRIAL_TEST_WITH(filter.variance(), 1.25, tolerance);
}